

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxx_gtest_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  UnitTest *this;
  TestEventListeners *this_00;
  TestEventListener *pTVar3;
  TestEventListener *listener;
  int iVar4;
  env e;
  int argc_local;
  comm c;
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  testing::InitGoogleTest(&argc_local,argv);
  mxx::env::env(&e,&argc_local,&argv_local);
  mxx::env::set_exception_on_error();
  mxx::comm::comm(&c);
  if (c.m_rank == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Running GTEST with MPI using ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,c.m_size);
    poVar2 = std::operator<<(poVar2," processes.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::listeners(this);
  pTVar3 = testing::TestEventListeners::Release(this_00,this_00->default_result_printer_);
  listener = (TestEventListener *)operator_new(0x18);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__TestEventListener_0012f3c8;
  *(int *)&listener[1]._vptr_TestEventListener = c.m_rank;
  listener[2]._vptr_TestEventListener = (_func_int **)pTVar3;
  testing::TestEventListeners::Append(this_00,listener);
  iVar1 = RUN_ALL_TESTS();
  iVar4 = 0;
  if (c.m_rank == 0) {
    iVar4 = iVar1;
  }
  mxx::comm::~comm(&c);
  mxx::env::~env(&e);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
    int result = 0;

    ::testing::InitGoogleTest(&argc, argv);

    mxx::env e(argc, argv);
    mxx::env::set_exception_on_error();
    mxx::comm c = mxx::comm();
    //MPI_Init(&argc, &argv);

    if (c.rank() == 0)
      std::cout << "Running GTEST with MPI using " << c.size() << " processes." << std::endl;

    // set up wrapped test listener
    ::testing::TestEventListeners& listeners = ::testing::UnitTest::GetInstance()->listeners();
    ::testing::TestEventListener* default_listener =  listeners.Release(listeners.default_result_printer());
    listeners.Append(new mxx_gtest::MpiTestEventListener(c.rank(), default_listener));

    // running tests
    result = RUN_ALL_TESTS();
    if (c.rank() != 0)
      result = 0;

    // clean up MPI
    //MPI_Finalize();

    // return good status no matter what
    return result;
}